

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::ValidationContextImpl::addId(ValidationContextImpl *this,XMLCh *content)

{
  short *psVar1;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *pRVar2;
  MemoryManager *pMVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  InvalidDatatypeValueException *this_00;
  XMLRefInfo *valueToAdopt;
  undefined4 extraout_var;
  XMLCh XVar8;
  RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *pRVar9;
  size_t __n;
  XMLCh *pXVar7;
  
  pRVar2 = this->fIdRefList;
  if ((pRVar2 != (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0) &&
     (this->fToCheckIdRefList == true)) {
    if ((content == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*content, uVar6 == 0)) {
      uVar6 = 0;
    }
    else {
      XVar8 = content[1];
      if (XVar8 != L'\0') {
        pXVar7 = content + 2;
        do {
          uVar6 = (ulong)(ushort)XVar8 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar8 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar8 != L'\0');
      }
      uVar6 = uVar6 % pRVar2->fHashModulus;
    }
    pRVar9 = pRVar2->fBucketList[uVar6];
    if (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0) {
      do {
        bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,content,pRVar9->fKey);
        if (bVar4) {
          valueToAdopt = pRVar9->fData;
          if (valueToAdopt != (XMLRefInfo *)0x0) {
            if (valueToAdopt->fDeclared == true) {
              this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
              InvalidDatatypeValueException::InvalidDatatypeValueException
                        (this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ValidationContextImpl.cpp"
                         ,0x61,VALUE_ID_Not_Unique,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                         (this->super_ValidationContext).fMemoryManager);
              __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,
                          XMLException::~XMLException);
            }
            goto LAB_002b588e;
          }
          break;
        }
        pRVar9 = pRVar9->fNext;
      } while (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0);
    }
    valueToAdopt = (XMLRefInfo *)
                   XMemory::operator_new(0x20,(this->super_ValidationContext).fMemoryManager);
    pMVar3 = (this->super_ValidationContext).fMemoryManager;
    (valueToAdopt->super_XSerializable)._vptr_XSerializable =
         (_func_int **)&PTR__XMLRefInfo_00408410;
    valueToAdopt->fDeclared = false;
    valueToAdopt->fUsed = false;
    valueToAdopt->fRefName = (XMLCh *)0x0;
    valueToAdopt->fMemoryManager = pMVar3;
    if (content == (XMLCh *)0x0) {
      pXVar7 = (XMLCh *)0x0;
    }
    else {
      __n = 0;
      do {
        psVar1 = (short *)((long)content + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar5 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,__n);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar5);
      memcpy(pXVar7,content,__n);
    }
    valueToAdopt->fRefName = pXVar7;
    RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
              (this->fIdRefList,pXVar7,valueToAdopt);
LAB_002b588e:
    valueToAdopt->fDeclared = true;
  }
  return;
}

Assistant:

void ValidationContextImpl::addId(const XMLCh * const content)
{
    if (!fIdRefList || !fToCheckIdRefList)
        return;

    XMLRefInfo* idEntry = fIdRefList->get(content);

    if (idEntry)
    {
        if (idEntry->getDeclared())
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_ID_Not_Unique
                    , content
                    , fMemoryManager);
        }
    }
    else
    {
        idEntry = new (fMemoryManager) XMLRefInfo(content, false, false, fMemoryManager);
        fIdRefList->put((void*)idEntry->getRefName(), idEntry);
    }

    //
    //  Mark it declared
    //
    idEntry->setDeclared(true);

}